

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O0

void print_timer(int n,TMCNT_H_t *tmcnth,int timer_reload,TMINT_t *tmint)

{
  char *pcVar1;
  ushort *in_RCX;
  uint in_EDX;
  ushort *in_RSI;
  uint in_EDI;
  char *tm0msg;
  char *enabled;
  char *prescaler_selection;
  char *local_28;
  
  local_28 = "UNKNOWN";
  switch(*in_RSI & 3) {
  case 0:
    local_28 = "F/1";
    break;
  case 1:
    local_28 = "F/64";
    break;
  case 2:
    local_28 = "F/256";
    break;
  case 3:
    local_28 = "F/1024";
  }
  pcVar1 = "disabled";
  if ((*in_RSI >> 7 & 1) != 0) {
    pcVar1 = "ENABLED";
  }
  DUI_Print("\nTimer %d: %s",(ulong)in_EDI,pcVar1);
  DUI_Newline();
  pcVar1 = "";
  if (in_EDI == 0) {
    pcVar1 = " (unused in Timer 0)";
  }
  DUI_Print(" Reload: 0x%04X\n Prescaler: %s\n Count-Up Timing:%s %d\n IRQ: %d\n Value: 0x%04X\n",
            (ulong)in_EDX,local_28,pcVar1,(ulong)((byte)(*in_RSI >> 2) & 1),
            (ulong)((byte)(*in_RSI >> 6) & 1),(uint)*in_RCX);
  DUI_Newline();
  return;
}

Assistant:

void print_timer(int n, TMCNT_H_t* tmcnth, int timer_reload, TMINT_t* tmint) {
    const char* prescaler_selection = "UNKNOWN";
    switch (tmcnth->frequency) {
        case 0:
            prescaler_selection = "F/1";
            break;
        case 1:
            prescaler_selection = "F/64";
            break;
        case 2:
            prescaler_selection = "F/256";
            break;
        case 3:
            prescaler_selection = "F/1024";
            break;
    }
    const char* enabled = tmcnth->start ? "ENABLED" : "disabled";
    DUI_Println("\nTimer %d: %s", n, enabled);
    const char* tm0msg = n == 0 ? " (unused in Timer 0)" : "";
    DUI_Println(" Reload: 0x%04X\n"
                " Prescaler: %s\n"
                " Count-Up Timing:%s %d\n"
                " IRQ: %d\n"
                " Value: 0x%04X\n",
                timer_reload,
                prescaler_selection,
                tm0msg,
                tmcnth->cascade,
                tmcnth->timer_irq_enable,
                tmint->value);
}